

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

VOID CorUnix::PROCRemoveThread(CPalThread *pCurrentThread,CPalThread *pTargetThread)

{
  CPalThread *pCVar1;
  CPalThread *pCVar2;
  
  InternalEnterCriticalSection(pCurrentThread,&g_csProcess);
  if (pGThreadList == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PROCRemoveThread",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x78e);
    fprintf(_stderr,"Thread list is empty.\n");
  }
  else {
    pCVar1 = pGThreadList;
    if (pGThreadList == pTargetThread) {
      pGThreadList = pGThreadList->m_pNext;
    }
    else {
      do {
        pCVar2 = pCVar1;
        pCVar1 = pCVar2->m_pNext;
        if (pCVar1 == (CPalThread *)0x0) goto LAB_0034ddf4;
      } while (pCVar1 != pTargetThread);
      pCVar2->m_pNext = pCVar1->m_pNext;
      g_dwThreadCount = g_dwThreadCount - 1;
    }
LAB_0034ddf4:
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
  }
  InternalLeaveCriticalSection(pCurrentThread,&g_csProcess);
  return;
}

Assistant:

VOID
CorUnix::PROCRemoveThread(
    CPalThread *pCurrentThread,
    CPalThread *pTargetThread
    )
{
    CPalThread *curThread, *prevThread;

    /* protect the access of the thread list with critical section for
       mutithreading access */
    InternalEnterCriticalSection(pCurrentThread, &g_csProcess);

    curThread = pGThreadList;

    /* if thread list is empty */
    if (curThread == NULL)
    {
        ASSERT("Thread list is empty.\n");
        goto EXIT;
    }

    /* do we remove the first thread? */
    if (curThread == pTargetThread)
    {
        pGThreadList =  curThread->GetNext();
        TRACE("Thread 0x%p (id %#x) removed from the process thread list\n",
            pTargetThread, pTargetThread->GetThreadId());
        goto EXIT;
    }

    prevThread = curThread;
    curThread = curThread->GetNext();
    /* find the thread to remove */
    while (curThread != NULL)
    {
        if (curThread == pTargetThread)
        {
            /* found, fix the chain list */
            prevThread->SetNext(curThread->GetNext());
            g_dwThreadCount -= 1;
            TRACE("Thread %p removed from the process thread list\n", pTargetThread);
            goto EXIT;
        }

        prevThread = curThread;
        curThread = curThread->GetNext();
    }

    WARN("Thread %p not removed (it wasn't found in the list)\n", pTargetThread);

EXIT:
    InternalLeaveCriticalSection(pCurrentThread, &g_csProcess);
}